

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManAddNextEntry_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  pGVar2 = p->pObjs;
  do {
    if (pOld < pGVar2) {
LAB_00202079:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pGVar2 + p->nObjs <= pOld) goto LAB_00202079;
    iVar3 = (int)((ulong)((long)pOld - (long)pGVar2) >> 2) * -0x55555555;
    uVar1 = p->pNexts[iVar3];
    if ((ulong)uVar1 == 0) {
      if ((pGVar2 <= pNode) && (pNode < pGVar2 + p->nObjs)) {
        p->pNexts[iVar3] = (int)((ulong)((long)pNode - (long)pGVar2) >> 2) * -0x55555555;
        return;
      }
      goto LAB_00202079;
    }
    if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pOld = pGVar2 + uVar1;
  } while( true );
}

Assistant:

void Gia_ManAddNextEntry_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode )
{
    if ( Gia_ObjNext(p, Gia_ObjId(p, pOld)) == 0 )
    {
        Gia_ObjSetNext( p, Gia_ObjId(p, pOld), Gia_ObjId(p, pNode) );
        return;
    }
    Gia_ManAddNextEntry_rec( p, Gia_ObjNextObj(p, Gia_ObjId(p, pOld)), pNode );
}